

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_raffects(CHAR_DATA *ch,char *argument)

{
  RUNE_DATA *pRVar1;
  EXIT_DATA *pEVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ROOM_AFFECT_DATA *pRVar6;
  flag_type *pfVar7;
  char *pcVar8;
  char *pcVar9;
  ROOM_INDEX_DATA *pRVar10;
  RUNE_DATA **ppRVar11;
  long lVar12;
  bool bVar13;
  char buf [4608];
  
  pRVar10 = ch->in_room;
  bVar13 = pRVar10->affected != (ROOM_AFFECT_DATA *)0x0;
  if (bVar13) {
    send_to_char("The room is affected by:\n\r",ch);
    pRVar6 = (ROOM_AFFECT_DATA *)&ch->in_room->affected;
    while (pRVar6 = pRVar6->next, pRVar6 != (ROOM_AFFECT_DATA *)0x0) {
      uVar4 = pRVar6->aftype;
      if (uVar4 == 0) {
        sprintf(buf,"Spell: \'%s\' ",skill_table[pRVar6->type].name);
        uVar4 = pRVar6->aftype;
      }
      if (uVar4 == 1) {
        sprintf(buf,"Skill: \'%s\' ",skill_table[pRVar6->type].name);
        uVar4 = pRVar6->aftype;
      }
      if (uVar4 == 2) {
        sprintf(buf,"Power: \'%s\' ",skill_table[pRVar6->type].name);
        uVar4 = pRVar6->aftype;
      }
      if (uVar4 == 4) {
        sprintf(buf,"Commune: \'%s\' ",skill_table[pRVar6->type].name);
        uVar4 = pRVar6->aftype;
      }
      if (4 < uVar4) {
        sprintf(buf,"Spell: \'%s\' ",skill_table[pRVar6->type].name);
      }
      send_to_char(buf,ch);
      pcVar5 = raffect_loc_name((int)pRVar6->location);
      pcVar8 = "aff";
      if (pRVar6->where == 1) {
        pcVar8 = "const";
      }
      if (pRVar6->where == 2) {
        pcVar8 = "flag";
      }
      pcVar9 = "none";
      if (pRVar6->owner != (CHAR_DATA *)0x0) {
        pcVar9 = pRVar6->owner->name;
      }
      sprintf(buf,"modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",pcVar5,
              (ulong)(uint)(int)pRVar6->modifier,(ulong)(uint)(int)(pRVar6->duration / 2),pcVar8,
              "nullptr",pcVar9,(ulong)(uint)(int)pRVar6->level);
      send_to_char(buf,ch);
    }
    pRVar10 = ch->in_room;
  }
  if (pRVar10->has_rune != false) {
    ppRVar11 = &pRVar10->rune;
    while (pRVar1 = *ppRVar11, pRVar1 != (RUNE_DATA *)0x0) {
      pcVar5 = skill_table[pRVar1->type].name;
      bVar3 = is_npc(pRVar1->owner);
      sprintf(buf,"Rune \'%s\' placed in room by %s, level %d, duration %d hours.\n\r",pcVar5,
              (&pRVar1->owner->name)[!bVar3],(ulong)(uint)pRVar1->level,
              (ulong)(uint)pRVar1->duration);
      send_to_char(buf,ch);
      ppRVar11 = &pRVar1->next_content;
    }
  }
  pfVar7 = direction_table;
  for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
    pEVar2 = ch->in_room->exit[lVar12];
    if ((pEVar2 != (EXIT_DATA *)0x0) && (pEVar2->has_rune == true)) {
      pRVar1 = pEVar2->rune;
      pcVar5 = skill_table[pRVar1->type].name;
      pcVar8 = pfVar7->name;
      bVar13 = is_npc(pRVar1->owner);
      sprintf(buf,"Rune \'%s\' placed on %s door by %s, level %d, duration %d hours.\n\r",pcVar5,
              pcVar8,(&pRVar1->owner->name)[!bVar13],(ulong)(uint)pRVar1->level,
              (ulong)(uint)pRVar1->duration);
      send_to_char(buf,ch);
      bVar13 = true;
    }
    pfVar7 = pfVar7 + 1;
  }
  if (!bVar13) {
    send_to_char("The room is not affected by anything.\n\r",ch);
  }
  return;
}

Assistant:

void do_raffects(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA *paf;
	RUNE_DATA *rune;
	char buf[MAX_STRING_LENGTH];
	bool found = false;
	int i = 0;

	if (ch->in_room->affected != nullptr)
	{
		found = true;
		send_to_char("The room is affected by:\n\r", ch);

		for (paf = ch->in_room->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->aftype == AFT_SPELL)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: '%s' ", skill_table[paf->type].name);

			if (paf->aftype != AFT_SPELL && paf->aftype != AFT_SKILL && paf->aftype != AFT_POWER &&
				paf->aftype != AFT_MALADY && paf->aftype != AFT_COMMUNE)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);
			send_to_char(buf, ch);

			sprintf(buf, "modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
				raffect_loc_name(paf->location),
				paf->modifier,
				paf->duration / 2,
				paf->where == TO_ROOM_FLAGS ? "flag" : paf->where == TO_ROOM_CONST ? "const" : "aff",
				"nullptr",
				paf->owner != nullptr ? paf->owner->name : "none",
				paf->level);
			send_to_char(buf, ch);
		}
	}

	if (ch->in_room->has_rune)
	{
		for (rune = ch->in_room->rune; rune; rune = rune->next_content)
		{
			sprintf(buf, "Rune '%s' placed in room by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level,
				rune->duration);
			send_to_char(buf, ch);
		}
	}

	for (i = 0; i < 6; i++)
	{
		if (ch->in_room->exit[i] && ch->in_room->exit[i]->has_rune == true)
		{
			rune = ch->in_room->exit[i]->rune;

			sprintf(buf, "Rune '%s' placed on %s door by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				direction_table[i].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level, rune->duration);
			send_to_char(buf, ch);

			found = true;
		}
	}

	if (!found)
		send_to_char("The room is not affected by anything.\n\r", ch);
}